

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void waiter(EventCount *eventCount)

{
  __int_type _Var1;
  long *plVar2;
  int iVar3;
  uint32_t expected;
  
  iVar3 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Preparing wait: ",0x10);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    LOCK();
    _Var1 = (eventCount->val_).super___atomic_base<unsigned_long>._M_i;
    (eventCount->val_).super___atomic_base<unsigned_long>._M_i =
         (eventCount->val_).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    while (expected = (uint32_t)(_Var1 >> 0x20),
          (uint32_t)((eventCount->val_).super___atomic_base<unsigned_long>._M_i >> 0x20) == expected
          ) {
      futexWait<std::atomic<unsigned_int>>
                ((atomic<unsigned_int> *)
                 ((long)&(eventCount->val_).super___atomic_base<unsigned_long>._M_i + 4),expected,
                 0xffffffff);
    }
    LOCK();
    (eventCount->val_).super___atomic_base<unsigned_long>._M_i =
         (eventCount->val_).super___atomic_base<unsigned_long>._M_i - 1;
    UNLOCK();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Got notification: ",0x12);
    plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
    std::ostream::put((char)plVar2);
    std::ostream::flush();
    iVar3 = iVar3 + 1;
  } while (iVar3 != 100);
  return;
}

Assistant:

void waiter(EventCount *eventCount) {
    for (int i = 0; i < 100; i++) {
        std::cout << "Preparing wait: " << i << std::endl;
        auto key = eventCount->prepareWait();
        eventCount->wait(key);
        std::cout << "Got notification: " << i << std::endl;
    }
}